

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::BatchLoader::LoadAll(BatchLoader *this)

{
  Importer *this_00;
  bool bVar1;
  reference pLVar2;
  Logger *pLVar3;
  basic_formatter *this_01;
  aiScene *paVar4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  ImporterPimpl *local_30;
  ImporterPimpl *pimpl;
  iterator iStack_20;
  uint pp;
  _Self local_18;
  LoadReqIt it;
  BatchLoader *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::begin
                 (&this->m_data->requests);
  while( true ) {
    iStack_20 = std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::end
                          (&this->m_data->requests);
    bVar1 = std::operator!=(&local_18,&stack0xffffffffffffffe0);
    if (!bVar1) break;
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    pimpl._4_4_ = pLVar2->flags;
    if ((this->m_data->validate & 1U) != 0) {
      pimpl._4_4_ = pimpl._4_4_ | 0x400;
    }
    local_30 = Importer::Pimpl(this->m_data->pImporter);
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    std::
    map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::operator=(&local_30->mFloatProperties,&(pLVar2->map).floats);
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    std::
    map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::operator=(&local_30->mIntProperties,&(pLVar2->map).ints);
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&local_30->mStringProperties,&(pLVar2->map).strings);
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    std::
    map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::operator=(&local_30->mMatrixProperties,&(pLVar2->map).matrices);
    bVar1 = DefaultLogger::isNullLogger();
    if (!bVar1) {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"%%% BEGIN EXTERNAL FILE %%%");
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>(&local_1c8,(char (*) [7])"File: ");
      pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
      this_01 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1c8,&pLVar2->file);
      Formatter::basic_formatter::operator_cast_to_string(&local_50,this_01);
      Logger::info(pLVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1c8);
    }
    this_00 = this->m_data->pImporter;
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    Importer::ReadFile(this_00,&pLVar2->file,pimpl._4_4_);
    paVar4 = Importer::GetOrphanedScene(this->m_data->pImporter);
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    pLVar2->scene = paVar4;
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    pLVar2->loaded = true;
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"%%% END EXTERNAL FILE %%%");
    std::_List_iterator<Assimp::LoadRequest>::operator++(&local_18);
  }
  return;
}

Assistant:

void BatchLoader::LoadAll()
{
    // no threaded implementation for the moment
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        // force validation in debug builds
        unsigned int pp = (*it).flags;
        if ( m_data->validate ) {
            pp |= aiProcess_ValidateDataStructure;
        }

        // setup config properties if necessary
        ImporterPimpl* pimpl = m_data->pImporter->Pimpl();
        pimpl->mFloatProperties  = (*it).map.floats;
        pimpl->mIntProperties    = (*it).map.ints;
        pimpl->mStringProperties = (*it).map.strings;
        pimpl->mMatrixProperties = (*it).map.matrices;

        if (!DefaultLogger::isNullLogger())
        {
            ASSIMP_LOG_INFO("%%% BEGIN EXTERNAL FILE %%%");
            ASSIMP_LOG_INFO_F("File: ", (*it).file);
        }
        m_data->pImporter->ReadFile((*it).file,pp);
        (*it).scene = m_data->pImporter->GetOrphanedScene();
        (*it).loaded = true;

        ASSIMP_LOG_INFO("%%% END EXTERNAL FILE %%%");
    }
}